

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O1

curi_status
parse_segments(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  ulong uVar1;
  curi_status cVar2;
  char *pcVar3;
  curi_status cVar4;
  
  cVar2 = curi_status_success;
  do {
    cVar4 = cVar2;
    uVar1 = *offset;
    pcVar3 = uri + uVar1;
    if (len <= uVar1) {
      pcVar3 = "";
    }
    *offset = uVar1 + 1;
    if (*pcVar3 != '/') {
      cVar2 = (uint)(*pcVar3 != '/') * 2;
    }
    else {
      cVar2 = parse_segment(uri,len,offset,settings,userData,0);
    }
  } while (cVar2 != curi_status_error);
  *offset = uVar1;
  return cVar4;
}

Assistant:

static curi_status parse_segments(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // segments  = *( "/" segment )
    curi_status status = curi_status_success;

    for ( ; ; )
    {
        size_t initialOffset = *offset;
        curi_status tryStatus = curi_status_success;

        if (tryStatus == curi_status_success)
            tryStatus = parse_char('/', uri, len, offset, settings, userData);

        if (tryStatus == curi_status_success)
            tryStatus = parse_segment(uri, len, offset, settings, userData, 0);

        if (tryStatus == curi_status_error)
        {
            *offset = initialOffset;
            break;
        }
        else
            status = tryStatus;
    }

    return status;
}